

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void triangle(vec2i *pts,TGAImage *image,TGAColor color)

{
  int iVar1;
  vec2i P_00;
  size_t sVar2;
  size_t sVar3;
  int *piVar4;
  int *piVar5;
  int *__b;
  undefined1 local_70 [8];
  vec3f bc_screen;
  int iStack_50;
  vec2i P;
  size_t j;
  size_t i;
  vec2i clamp;
  vec2i bboxmax;
  vec2i bboxmin;
  TGAImage *image_local;
  vec2i *pts_local;
  TGAColor color_local;
  
  pts_local._3_4_ = color.bgra;
  pts_local._7_1_ = color.bytespp;
  sVar2 = TGAImage::get_width(image);
  sVar3 = TGAImage::get_height(image);
  vec<2UL,_int>::vec(&bboxmax,(int)sVar2 + -1,(int)sVar3 + -1);
  vec<2UL,_int>::vec(&clamp,0,0);
  sVar2 = TGAImage::get_width(image);
  sVar3 = TGAImage::get_height(image);
  vec<2UL,_int>::vec((vec<2UL,_int> *)&i,(int)sVar2 + -1,(int)sVar3 + -1);
  for (j = 0; j < 3; j = j + 1) {
    for (stack0xffffffffffffffb8 = 0; stack0xffffffffffffffb8 < 2;
        register0x00000000 = stack0xffffffffffffffb8 + 1) {
      P.x = 0;
      piVar4 = vec<2UL,_int>::operator[](&bboxmax,stack0xffffffffffffffb8);
      piVar5 = vec<2UL,_int>::operator[](pts + j,stack0xffffffffffffffb8);
      piVar4 = std::min<int>(piVar4,piVar5);
      piVar4 = std::max<int>(&P.x,piVar4);
      iVar1 = *piVar4;
      piVar4 = vec<2UL,_int>::operator[](&bboxmax,stack0xffffffffffffffb8);
      *piVar4 = iVar1;
      piVar4 = vec<2UL,_int>::operator[]((vec<2UL,_int> *)&i,stack0xffffffffffffffb8);
      piVar5 = vec<2UL,_int>::operator[](&clamp,stack0xffffffffffffffb8);
      __b = vec<2UL,_int>::operator[](pts + j,stack0xffffffffffffffb8);
      piVar5 = std::max<int>(piVar5,__b);
      piVar4 = std::min<int>(piVar4,piVar5);
      iVar1 = *piVar4;
      piVar4 = vec<2UL,_int>::operator[](&clamp,stack0xffffffffffffffb8);
      *piVar4 = iVar1;
    }
  }
  vec<2UL,_int>::vec((vec<2UL,_int> *)((long)&bc_screen.z + 4));
  for (bc_screen.z._4_4_ = bboxmax.x; bc_screen.z._4_4_ <= clamp.x;
      bc_screen.z._4_4_ = bc_screen.z._4_4_ + 1) {
    for (iStack_50 = bboxmax.y; iStack_50 <= clamp.y; iStack_50 = iStack_50 + 1) {
      P_00.y = iStack_50;
      P_00.x = bc_screen.z._4_4_;
      barycentric((vec3f *)local_70,pts,P_00);
      if (((0.0 <= (double)local_70) && (0.0 <= bc_screen.x)) && (0.0 <= bc_screen.y)) {
        TGAImage::set(image,(long)bc_screen.z._4_4_,(long)iStack_50,
                      (TGAColor *)((long)&pts_local + 3));
      }
    }
  }
  return;
}

Assistant:

void triangle(vec2i *pts, TGAImage &image, TGAColor color)
{
    vec2i bboxmin(image.get_width() - 1, image.get_height() - 1);
    vec2i bboxmax(0, 0);
    vec2i clamp(image.get_width() - 1, image.get_height() - 1);
    for (size_t i = 0; i < 3; i++) {
        for (size_t j = 0; j < 2; j++) {
            bboxmin[j] = std::max(0, std::min(bboxmin[j], pts[i][j]));
            bboxmax[j] = std::min(clamp[j], std::max(bboxmax[j], pts[i][j]));
        }
    }
    vec2i P;
    for (P.x = bboxmin.x; P.x <= bboxmax.x; P.x++) {
        for (P.y = bboxmin.y; P.y <= bboxmax.y; P.y++) {
            vec3f bc_screen = barycentric(pts, P);
            if (bc_screen.x < 0 || bc_screen.y < 0 || bc_screen.z < 0) continue;
            image.set(static_cast<int>(P.x), static_cast<int>(P.y), color);
        }
    }
}